

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHelpers.cpp
# Opt level: O3

int StringHelpers::stringToNumber(string *s)

{
  long *plVar1;
  int iVar2;
  int result;
  istringstream convert;
  int local_18c;
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  std::__cxx11::istringstream::istringstream(local_188,(string *)s,_S_in);
  plVar1 = (long *)std::istream::operator>>((istream *)local_188,&local_18c);
  iVar2 = 0;
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    iVar2 = local_18c;
  }
  std::__cxx11::istringstream::~istringstream(local_188);
  std::ios_base::~ios_base(local_110);
  return iVar2;
}

Assistant:

int StringHelpers::stringToNumber(string s)
{
	istringstream convert(s);
	int result;
	if (!(convert >> result))
	{
		result = 0;
	}
	return result;
}